

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringsTest.cc
# Opt level: O0

int main(int param_1,char **param_2)

{
  allocator<unsigned_long> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  initializer_list<unsigned_long> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_23;
  FILE *__stream;
  pointer __s;
  bool bVar2;
  __type _Var3;
  char *pcVar4;
  size_t sVar5;
  reference pvVar6;
  undefined1 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2ff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2ed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2de0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2ce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_29e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2850;
  allocator<char> local_25a9;
  string local_25a8;
  string local_2588;
  allocator<char> local_2561;
  string local_2560;
  string local_2540;
  allocator<char> local_2519;
  string local_2518;
  string local_24f8;
  allocator<char> local_24d1;
  string local_24d0;
  string local_24b0;
  allocator<char> local_2489;
  string local_2488;
  string local_2468;
  allocator<char> local_2441;
  string local_2440;
  string local_2420;
  allocator<char> local_23f9;
  string local_23f8;
  string local_23d8;
  string local_23b8;
  string local_2398;
  string local_2378;
  string local_2358;
  string local_2338;
  string local_2318;
  string local_22f8;
  undefined1 local_22d8 [8];
  string formatted_1;
  undefined1 local_22b0 [8];
  string expected_formatted_1;
  undefined1 local_2288 [8];
  string input_2;
  undefined1 local_2248 [8];
  string formatted_hex;
  undefined1 local_2208 [8];
  string formatted;
  undefined1 local_21e0 [8];
  string expected_formatted_hex;
  undefined1 local_21b8 [8];
  string expected_formatted;
  undefined1 local_2190 [8];
  string input_1;
  undefined1 local_2150 [8];
  string formatted_input_1;
  undefined1 local_2128 [8];
  string expected_formatted_input_1;
  undefined1 local_20e8 [8];
  string formatted_input;
  undefined1 local_20c0 [8];
  string expected_formatted_input;
  string output_data;
  string output_mask;
  undefined1 local_2058 [8];
  string expected_mask;
  undefined1 local_2030 [8];
  string expected_data;
  undefined1 local_2008 [8];
  string input;
  size_t offset_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets_1;
  undefined1 local_1fc0 [8];
  string sentence_str;
  size_t offset;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  unsigned_long local_1f78 [10];
  iterator local_1f28;
  size_type local_1f20;
  undefined1 local_1f18 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> expected_offsets;
  char *sentence;
  string local_1ef0;
  allocator<char> local_1ec9;
  string local_1ec8;
  allocator<char> local_1ea1;
  string local_1ea0;
  allocator<char> local_1e79;
  string local_1e78;
  allocator<char> local_1e51;
  string local_1e50;
  allocator<char> local_1e29;
  string local_1e28;
  allocator<char> local_1e01;
  string local_1e00;
  allocator<char> local_1dd9;
  string local_1dd8;
  allocator<char> local_1db1;
  string local_1db0;
  allocator<char> local_1d89;
  string local_1d88;
  allocator<char> local_1d61;
  string local_1d60;
  allocator<char> local_1d39;
  string local_1d38;
  allocator<char> local_1d11;
  string local_1d10;
  allocator<char> local_1ce9;
  string local_1ce8;
  allocator<char> local_1cc1;
  string local_1cc0;
  allocator<char> local_1c99;
  string local_1c98;
  allocator<char> local_1c71;
  string local_1c70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c50;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c36;
  undefined1 local_1c35;
  allocator<char> local_1c34;
  allocator<char> local_1c33;
  allocator<char> local_1c32;
  allocator<char> local_1c31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c28;
  string local_1c08 [32];
  string local_1be8 [32];
  string local_1bc8 [32];
  undefined1 local_1ba8 [47];
  allocator<char> local_1b79;
  string local_1b78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b58;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b3d;
  undefined1 local_1b3c;
  allocator<char> local_1b3b;
  allocator<char> local_1b3a;
  allocator<char> local_1b39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b30;
  string local_1b10 [32];
  string local_1af0 [32];
  undefined1 local_1ad0 [47];
  allocator<char> local_1aa1;
  string local_1aa0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a80;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a65;
  undefined1 local_1a64;
  allocator<char> local_1a63;
  allocator<char> local_1a62;
  allocator<char> local_1a61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a58;
  string local_1a38 [32];
  string local_1a18 [32];
  undefined1 local_19f8 [47];
  allocator<char> local_19c9;
  string local_19c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_19a8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198d;
  undefined1 local_198c;
  allocator<char> local_198b;
  allocator<char> local_198a;
  allocator<char> local_1989;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1980;
  string local_1960 [32];
  string local_1940 [32];
  undefined1 local_1920 [47];
  allocator<char> local_18f1;
  string local_18f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_18d0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18b5;
  undefined1 local_18b4;
  allocator<char> local_18b3;
  allocator<char> local_18b2;
  allocator<char> local_18b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18a8;
  string local_1888 [32];
  string local_1868 [32];
  undefined1 local_1848 [47];
  allocator<char> local_1819;
  string local_1818;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_17f8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17dd;
  undefined1 local_17dc;
  allocator<char> local_17db;
  allocator<char> local_17da;
  allocator<char> local_17d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_17d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17d0;
  string local_17b0 [32];
  string local_1790 [32];
  undefined1 local_1770 [47];
  allocator<char> local_1741;
  string local_1740;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1720;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1705;
  undefined1 local_1704;
  allocator<char> local_1703;
  allocator<char> local_1702;
  allocator<char> local_1701;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16f8;
  string local_16d8 [32];
  string local_16b8 [32];
  undefined1 local_1698 [47];
  allocator<char> local_1669;
  string local_1668;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1648;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_162e;
  undefined1 local_162d;
  allocator<char> local_162c;
  allocator<char> local_162b;
  allocator<char> local_162a;
  allocator<char> local_1629;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1620;
  string local_1600 [32];
  string local_15e0 [32];
  string local_15c0 [32];
  undefined1 local_15a0 [47];
  allocator<char> local_1571;
  string local_1570;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1550;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1538;
  allocator<char> local_1511;
  string local_1510;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_14f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_14d8;
  allocator<char> local_14b9;
  string local_14b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1498;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_147c;
  undefined1 local_147b;
  allocator<char> local_147a;
  allocator<char> local_1479;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1470;
  string local_1450 [32];
  undefined1 local_1430 [47];
  allocator<char> local_1401;
  string local_1400;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_13e0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_13c4;
  undefined1 local_13c3;
  allocator<char> local_13c2;
  allocator<char> local_13c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_13c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13b8;
  string local_1398 [32];
  undefined1 local_1378 [47];
  allocator<char> local_1349;
  string local_1348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1328;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130d;
  undefined1 local_130c;
  allocator<char> local_130b;
  allocator<char> local_130a;
  allocator<char> local_1309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1300;
  string local_12e0 [32];
  string local_12c0 [32];
  undefined1 local_12a0 [47];
  allocator<char> local_1271;
  string local_1270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1250;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1235;
  undefined1 local_1234;
  allocator<char> local_1233;
  allocator<char> local_1232;
  allocator<char> local_1231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1228;
  string local_1208 [32];
  string local_11e8 [32];
  undefined1 local_11c8 [47];
  allocator<char> local_1199;
  string local_1198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1178;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_115d;
  undefined1 local_115c;
  allocator<char> local_115b;
  allocator<char> local_115a;
  allocator<char> local_1159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1150;
  string local_1130 [32];
  string local_1110 [32];
  undefined1 local_10f0 [47];
  allocator<char> local_10c1;
  string local_10c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_10a0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1084;
  undefined1 local_1083;
  allocator<char> local_1082;
  allocator<char> local_1081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1078;
  string local_1058 [32];
  undefined1 local_1038 [47];
  allocator<char> local_1009;
  string local_1008;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_fe8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_fcd;
  undefined1 local_fcc;
  allocator<char> local_fcb;
  allocator<char> local_fca;
  allocator<char> local_fc9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_fc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc0;
  string local_fa0 [32];
  string local_f80 [32];
  undefined1 local_f60 [47];
  allocator<char> local_f31;
  string local_f30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f10;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ef6;
  undefined1 local_ef5;
  allocator<char> local_ef4;
  allocator<char> local_ef3;
  allocator<char> local_ef2;
  allocator<char> local_ef1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee8;
  string local_ec8 [32];
  string local_ea8 [32];
  string local_e88 [32];
  undefined1 local_e68 [47];
  allocator<char> local_e39;
  string local_e38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e18;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_dfd;
  undefined1 local_dfc;
  allocator<char> local_dfb;
  allocator<char> local_dfa;
  allocator<char> local_df9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_df8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df0;
  string local_dd0 [32];
  string local_db0 [32];
  undefined1 local_d90 [47];
  allocator<char> local_d61;
  string local_d60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d40;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d23;
  undefined1 local_d22;
  allocator<char> local_d21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d18;
  undefined1 local_cf8 [47];
  allocator<char> local_cc9;
  string local_cc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ca8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8f;
  undefined1 local_c8e;
  allocator<char> local_c8d;
  allocator<char> local_c8c;
  allocator<char> local_c8b;
  allocator<char> local_c8a;
  allocator<char> local_c89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c80;
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [32];
  undefined1 local_be0 [47];
  allocator<char> local_bb1;
  string local_bb0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b90;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b76;
  undefined1 local_b75;
  allocator<char> local_b74;
  allocator<char> local_b73;
  allocator<char> local_b72;
  allocator<char> local_b71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b68;
  string local_b48 [32];
  string local_b28 [32];
  string local_b08 [32];
  undefined1 local_ae8 [47];
  allocator<char> local_ab9;
  string local_ab8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a98;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a7d;
  undefined1 local_a7c;
  allocator<char> local_a7b;
  allocator<char> local_a7a;
  allocator<char> local_a79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  string local_a50 [32];
  string local_a30 [32];
  undefined1 local_a10 [47];
  allocator<char> local_9e1;
  string local_9e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9c0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9a3;
  undefined1 local_9a2;
  allocator<char> local_9a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  undefined1 local_978 [47];
  allocator<char> local_949;
  string local_948;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_928;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90f;
  undefined1 local_90e;
  allocator<char> local_90d;
  allocator<char> local_90c;
  allocator<char> local_90b;
  allocator<char> local_90a;
  allocator<char> local_909;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  undefined1 local_860 [47];
  allocator<char> local_831;
  string local_830;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_810;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7f6;
  undefined1 local_7f5;
  allocator<char> local_7f4;
  allocator<char> local_7f3;
  allocator<char> local_7f2;
  allocator<char> local_7f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  string local_7c8 [32];
  string local_7a8 [32];
  string local_788 [32];
  undefined1 local_768 [40];
  undefined1 local_740 [8];
  string result;
  undefined1 local_718 [8];
  string s_1;
  undefined1 local_6f0 [8];
  string s;
  undefined1 local_6c8 [8];
  string s5_1;
  undefined1 local_6a0 [8];
  string s4_1;
  undefined1 local_678 [8];
  string s3_1;
  undefined1 local_650 [8];
  string s2_1;
  undefined1 local_628 [8];
  string s1_1;
  undefined1 local_600 [8];
  string s5;
  undefined1 local_5d8 [8];
  string s4;
  undefined1 local_5b0 [8];
  string s3;
  undefined1 local_588 [8];
  string s2;
  undefined1 local_560 [8];
  string s1;
  string local_538;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  string local_488;
  allocator<char> local_461;
  string local_460;
  string local_440;
  allocator<char> local_419;
  string local_418;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  char **local_18;
  char **param_1_local;
  int param_0_local;
  
  param_1_local._4_4_ = 0;
  local_18 = param_2;
  param_1_local._0_4_ = param_1;
  fprintf(_stderr,"-- starts_with\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"abcdef",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"abc",&local_71);
  bVar2 = phosg::starts_with(&local_38,&local_70);
  phosg::expect_generic
            (bVar2,"!(starts_with(\"abcdef\", \"abc\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1b8);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"abcdef",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"abcdef",&local_c1);
  bVar2 = phosg::starts_with(&local_98,&local_c0);
  phosg::expect_generic
            (bVar2,"!(starts_with(\"abcdef\", \"abcdef\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1b9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"abcdef",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"abcdefg",&local_111);
  bVar2 = phosg::starts_with(&local_e8,&local_110);
  phosg::expect_generic
            ((bool)(~bVar2 & 1),"!(!starts_with(\"abcdef\", \"abcdefg\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1ba);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"abcdef",&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"abd",&local_161);
  bVar2 = phosg::starts_with(&local_138,&local_160);
  phosg::expect_generic
            ((bool)(~bVar2 & 1),"!(!starts_with(\"abcdef\", \"abd\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1bb);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"abcdef",&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"dbc",&local_1b1);
  bVar2 = phosg::starts_with(&local_188,&local_1b0);
  phosg::expect_generic
            ((bool)(~bVar2 & 1),"!(!starts_with(\"abcdef\", \"dbc\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1bc);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  fprintf(_stderr,"-- ends_with\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"abcdef",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"def",&local_201);
  bVar2 = phosg::ends_with(&local_1d8,&local_200);
  phosg::expect_generic
            (bVar2,"!(ends_with(\"abcdef\", \"def\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1bf);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"abcdef",&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"abcdef",&local_251);
  bVar2 = phosg::ends_with(&local_228,&local_250);
  phosg::expect_generic
            (bVar2,"!(ends_with(\"abcdef\", \"abcdef\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c0);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"abcdef",&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"gabcdef",&local_2a1);
  bVar2 = phosg::ends_with(&local_278,&local_2a0);
  phosg::expect_generic
            ((bool)(~bVar2 & 1),"!(!ends_with(\"abcdef\", \"gabcdef\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c1);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"abcdef",&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"ded",&local_2f1);
  bVar2 = phosg::ends_with(&local_2c8,&local_2f0);
  phosg::expect_generic
            ((bool)(~bVar2 & 1),"!(!ends_with(\"abcdef\", \"ded\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c2);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"abcdef",&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"fef",&local_341);
  bVar2 = phosg::ends_with(&local_318,&local_340);
  phosg::expect_generic
            ((bool)(~bVar2 & 1),"!(!ends_with(\"abcdef\", \"fef\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c3);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  fprintf(_stderr,"-- str_replace_all\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"",&local_389);
  phosg::str_replace_all(&local_368,&local_388,"def","xyz");
  bVar2 = std::operator==(&local_368,"");
  phosg::expect_generic
            (bVar2,"\"\" != str_replace_all(string(\"\"), \"def\", \"xyz\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c7);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"abcdef",&local_3d1);
  phosg::str_replace_all(&local_3b0,&local_3d0,"efg","xyz");
  bVar2 = std::operator==(&local_3b0,"abcdef");
  phosg::expect_generic
            (bVar2,"\"abcdef\" != str_replace_all(string(\"abcdef\"), \"efg\", \"xyz\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c8);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"abcdef",&local_419);
  phosg::str_replace_all(&local_3f8,&local_418,"def","xyz");
  bVar2 = std::operator==(&local_3f8,"abcxyz");
  phosg::expect_generic
            (bVar2,"\"abcxyz\" != str_replace_all(string(\"abcdef\"), \"def\", \"xyz\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c9);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"abcdefabc",&local_461);
  phosg::str_replace_all(&local_440,&local_460,"def","xyz");
  bVar2 = std::operator==(&local_440,"abcxyzabc");
  phosg::expect_generic
            (bVar2,"\"abcxyzabc\" != str_replace_all(string(\"abcdefabc\"), \"def\", \"xyz\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1ca);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"abcdefabcdef",&local_4a9)
  ;
  phosg::str_replace_all(&local_488,&local_4a8,"def","xyz");
  bVar2 = std::operator==(&local_488,"abcxyzabcxyz");
  phosg::expect_generic
            (bVar2,"\"abcxyzabcxyz\" != str_replace_all(string(\"abcdefabcdef\"), \"def\", \"xyz\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1cb);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"abcdefabcdefabc",&local_4f1);
  phosg::str_replace_all(&local_4d0,&local_4f0,"def","xyz");
  bVar2 = std::operator==(&local_4d0,"abcxyzabcxyzabc");
  phosg::expect_generic
            (bVar2,
             "\"abcxyzabcxyzabc\" != str_replace_all(string(\"abcdefabcdefabc\"), \"def\", \"xyz\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1cc);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,"defabcdefabcdefabc",
             (allocator<char> *)(s1.field_2._M_local_buf + 0xf));
  phosg::str_replace_all(&local_518,&local_538,"def","xyz");
  bVar2 = std::operator==(&local_518,"xyzabcxyzabcxyzabc");
  phosg::expect_generic
            (bVar2,
             "\"xyzabcxyzabcxyzabc\" != str_replace_all(string(\"defabcdefabcdefabc\"), \"def\", \"xyz\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1cd);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator((allocator<char> *)(s1.field_2._M_local_buf + 0xf));
  fprintf(_stderr,"-- strip_trailing_zeroes\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_560,"abcdef",6,(allocator<char> *)(s2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(s2.field_2._M_local_buf + 0xf));
  phosg::strip_trailing_zeroes<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_560,"abcdef");
  phosg::expect_generic
            (bVar2,"s1 != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1d4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_588,"abcdef",7,(allocator<char> *)(s3.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(s3.field_2._M_local_buf + 0xf));
  phosg::strip_trailing_zeroes<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_588,"abcdef");
  phosg::expect_generic
            (bVar2,"s2 != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1d7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_5b0,"abcdef",0xb,(allocator<char> *)(s4.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(s4.field_2._M_local_buf + 0xf));
  phosg::strip_trailing_zeroes<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_5b0,"abcdef");
  phosg::expect_generic
            (bVar2,"s3 != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1da);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_5d8,"",0,(allocator<char> *)(s5.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(s5.field_2._M_local_buf + 0xf));
  phosg::strip_trailing_zeroes<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_5d8,"");
  phosg::expect_generic
            (bVar2,"s4 != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1dd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_600,"",5,(allocator<char> *)(s1_1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(s1_1.field_2._M_local_buf + 0xf));
  phosg::strip_trailing_zeroes<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_600,"");
  phosg::expect_generic
            (bVar2,"s5 != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1e0);
  std::__cxx11::string::~string((string *)local_600);
  std::__cxx11::string::~string((string *)local_5d8);
  std::__cxx11::string::~string((string *)local_5b0);
  std::__cxx11::string::~string((string *)local_588);
  std::__cxx11::string::~string((string *)local_560);
  fprintf(_stderr,"-- strip_trailing_whitespace\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_628,"abcdef",(allocator<char> *)(s2_1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(s2_1.field_2._M_local_buf + 0xf));
  phosg::strip_trailing_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_628,"abcdef");
  phosg::expect_generic
            (bVar2,"s1 != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1e7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_650,"abcdef\r\n",(allocator<char> *)(s3_1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(s3_1.field_2._M_local_buf + 0xf));
  phosg::strip_trailing_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_650,"abcdef");
  phosg::expect_generic
            (bVar2,"s2 != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1ea);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_678,"abc\tdef  \r\n",
             (allocator<char> *)(s4_1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(s4_1.field_2._M_local_buf + 0xf));
  phosg::strip_trailing_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_678);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_678,"abc\tdef");
  phosg::expect_generic
            (bVar2,"s3 != \"abc\\tdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1ed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_6a0,"",(allocator<char> *)(s5_1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(s5_1.field_2._M_local_buf + 0xf));
  phosg::strip_trailing_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a0);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_6a0,"");
  phosg::expect_generic
            (bVar2,"s4 != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_6c8,"   \t\r\n  ",(allocator<char> *)(s.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(s.field_2._M_local_buf + 0xf));
  phosg::strip_trailing_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_6c8,"");
  phosg::expect_generic
            (bVar2,"s5 != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,499);
  std::__cxx11::string::~string((string *)local_6c8);
  std::__cxx11::string::~string((string *)local_6a0);
  std::__cxx11::string::~string((string *)local_678);
  std::__cxx11::string::~string((string *)local_650);
  std::__cxx11::string::~string((string *)local_628);
  fprintf(_stderr,"-- strip_whitespace\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_6f0,"abcdef",(allocator<char> *)(s_1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(s_1.field_2._M_local_buf + 0xf));
  phosg::strip_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_6f0,"abcdef");
  phosg::expect_generic
            (bVar2,"s != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1fb);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0,
             "abcdef\r\n");
  phosg::strip_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_6f0,"abcdef");
  phosg::expect_generic
            (bVar2,"s != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1ff);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0,
             "  \nabc\tdef");
  phosg::strip_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_6f0,"abc\tdef");
  phosg::expect_generic
            (bVar2,"s != \"abc\\tdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x203);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0,
             "  \nabc\tdef  \r\n");
  phosg::strip_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_6f0,"abc\tdef");
  phosg::expect_generic
            (bVar2,"s != \"abc\\tdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x207);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0,"");
  phosg::strip_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_6f0,"");
  phosg::expect_generic
            (bVar2,"s != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x20b);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0,
             "   \t\r\n  ");
  phosg::strip_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_6f0,"");
  phosg::expect_generic
            (bVar2,"s != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x20f);
  std::__cxx11::string::~string((string *)local_6f0);
  fprintf(_stderr,"-- strip_multiline_comments\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_718,"abc/*def*/ghi",
             (allocator<char> *)(result.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(result.field_2._M_local_buf + 0xf));
  phosg::strip_multiline_comments<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718,false);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_718,"abcghi");
  phosg::expect_generic
            (bVar2,"s != \"abcghi\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x217);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718,
             "/*abc*/def\r\n");
  phosg::strip_multiline_comments<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718,false);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_718,"def\r\n");
  phosg::expect_generic
            (bVar2,"s != \"def\\r\\n\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x21b);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718,
             "abc\n/*def\nghi*/\njkl");
  phosg::strip_multiline_comments<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718,false);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_718,"abc\n\n\njkl");
  phosg::expect_generic
            (bVar2,"s != \"abc\\n\\n\\njkl\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x21f);
  std::__cxx11::string::~string((string *)local_718);
  fprintf(_stderr,"-- string_printf\n");
  phosg::string_printf_abi_cxx11_((string *)local_740,"%s %lu 0x%04hX","lolz",1000,0x4f);
  __stream = _stderr;
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((string *)local_740);
  fprintf(__stream,"%s\n",pcVar4);
  bVar2 = std::operator==((string *)local_740,"lolz 1000 0x004F");
  phosg::expect_generic
            (bVar2,"\"lolz 1000 0x004F\" != result",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x227);
  std::__cxx11::string::~string((string *)local_740);
  fprintf(_stderr,"-- split\n");
  local_7f5 = 1;
  local_7f0 = &local_7e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e8,"12",&local_7f1);
  local_7f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7c8,"34",&local_7f2);
  local_7f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7a8,"567",&local_7f3);
  local_7f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_788;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_788,"abc",&local_7f4);
  local_7f5 = 0;
  local_768._0_8_ = &local_7e8;
  local_768._8_8_ = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_7f6);
  __l_23._M_len = local_768._8_8_;
  __l_23._M_array = (iterator)local_768._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_768 + 0x10),__l_23,&local_7f6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_830,"12,34,567,abc",&local_831);
  phosg::split(&local_810,&local_830,',',0);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_768 + 0x10),&local_810);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"34\", \"567\", \"abc\"}) != split(\"12,34,567,abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x22c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_810);
  std::__cxx11::string::~string((string *)&local_830);
  std::allocator<char>::~allocator(&local_831);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_768 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_7f6);
  local_2850 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768;
  do {
    local_2850 = local_2850 + -1;
    std::__cxx11::string::~string((string *)local_2850);
  } while (local_2850 != &local_7e8);
  std::allocator<char>::~allocator(&local_7f4);
  std::allocator<char>::~allocator(&local_7f3);
  std::allocator<char>::~allocator(&local_7f2);
  std::allocator<char>::~allocator(&local_7f1);
  local_90e = 1;
  local_908 = &local_900;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,"12",&local_909);
  local_908 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8e0,"34",&local_90a);
  local_908 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8c0,"567",&local_90b);
  local_908 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8a0,"",&local_90c);
  local_908 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_880;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_880,"",&local_90d);
  local_90e = 0;
  local_860._0_8_ = &local_900;
  local_860._8_8_ = 5;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_90f);
  __l_22._M_len = local_860._8_8_;
  __l_22._M_array = (iterator)local_860._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_860 + 0x10),__l_22,&local_90f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"12,34,567,,",&local_949);
  phosg::split(&local_928,&local_948,',',0);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_860 + 0x10),&local_928);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"34\", \"567\", \"\", \"\"}) != split(\"12,34,567,,\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x22d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_928);
  std::__cxx11::string::~string((string *)&local_948);
  std::allocator<char>::~allocator(&local_949);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_860 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_90f);
  local_28d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_860;
  do {
    local_28d0 = local_28d0 + -1;
    std::__cxx11::string::~string((string *)local_28d0);
  } while (local_28d0 != &local_900);
  std::allocator<char>::~allocator(&local_90d);
  std::allocator<char>::~allocator(&local_90c);
  std::allocator<char>::~allocator(&local_90b);
  std::allocator<char>::~allocator(&local_90a);
  std::allocator<char>::~allocator(&local_909);
  local_9a2 = 1;
  local_9a0 = &local_998;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_998,"",&local_9a1);
  local_9a2 = 0;
  local_978._0_8_ = &local_998;
  local_978._8_8_ = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_9a3);
  __l_21._M_len = local_978._8_8_;
  __l_21._M_array = (iterator)local_978._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_978 + 0x10),__l_21,&local_9a3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e0,"",&local_9e1);
  phosg::split(&local_9c0,&local_9e0,',',0);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_978 + 0x10),&local_9c0);
  phosg::expect_generic
            (bVar2,"vector<string>({\"\"}) != split(\"\", \',\')",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x22e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9c0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::allocator<char>::~allocator(&local_9e1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_978 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_9a3);
  local_2910 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_978;
  do {
    local_2910 = local_2910 + -1;
    std::__cxx11::string::~string((string *)local_2910);
  } while (local_2910 != &local_998);
  std::allocator<char>::~allocator(&local_9a1);
  local_a7c = 1;
  local_a78 = &local_a70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a70,"a",&local_a79);
  local_a78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a50,"b",&local_a7a);
  local_a78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a30,"c d e f",&local_a7b);
  local_a7c = 0;
  local_a10._0_8_ = &local_a70;
  local_a10._8_8_ = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_a7d);
  __l_20._M_len = local_a10._8_8_;
  __l_20._M_array = (iterator)local_a10._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_a10 + 0x10),__l_20,&local_a7d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ab8,"a b c d e f",&local_ab9);
  phosg::split(&local_a98,&local_ab8,' ',2);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_a10 + 0x10),&local_a98);
  phosg::expect_generic
            (bVar2,"vector<string>({\"a\", \"b\", \"c d e f\"}) != split(\"a b c d e f\", \' \', 2)"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x22f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a98);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::allocator<char>::~allocator(&local_ab9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_a10 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_a7d);
  local_2970 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a10;
  do {
    local_2970 = local_2970 + -1;
    std::__cxx11::string::~string((string *)local_2970);
  } while (local_2970 != &local_a70);
  std::allocator<char>::~allocator(&local_a7b);
  std::allocator<char>::~allocator(&local_a7a);
  std::allocator<char>::~allocator(&local_a79);
  fprintf(_stderr,"-- split_context\n");
  local_b75 = 1;
  local_b70 = &local_b68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b68,"12",&local_b71);
  local_b70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b48,"34",&local_b72);
  local_b70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b28,"567",&local_b73);
  local_b70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b08,"abc",&local_b74);
  local_b75 = 0;
  local_ae8._0_8_ = &local_b68;
  local_ae8._8_8_ = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_b76);
  __l_19._M_len = local_ae8._8_8_;
  __l_19._M_array = (iterator)local_ae8._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_ae8 + 0x10),__l_19,&local_b76);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bb0,"12,34,567,abc",&local_bb1);
  phosg::split_context(&local_b90,&local_bb0,',',0);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_ae8 + 0x10),&local_b90);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"34\", \"567\", \"abc\"}) != split_context(\"12,34,567,abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x234);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b90);
  std::__cxx11::string::~string((string *)&local_bb0);
  std::allocator<char>::~allocator(&local_bb1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_ae8 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_b76);
  local_29e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ae8;
  do {
    local_29e0 = local_29e0 + -1;
    std::__cxx11::string::~string((string *)local_29e0);
  } while (local_29e0 != &local_b68);
  std::allocator<char>::~allocator(&local_b74);
  std::allocator<char>::~allocator(&local_b73);
  std::allocator<char>::~allocator(&local_b72);
  std::allocator<char>::~allocator(&local_b71);
  local_c8e = 1;
  local_c88 = &local_c80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c80,"12",&local_c89);
  local_c88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c60,"34",&local_c8a);
  local_c88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c40,"567",&local_c8b);
  local_c88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c20,"",&local_c8c);
  local_c88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c00,"",&local_c8d);
  local_c8e = 0;
  local_be0._0_8_ = &local_c80;
  local_be0._8_8_ = 5;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_c8f);
  __l_18._M_len = local_be0._8_8_;
  __l_18._M_array = (iterator)local_be0._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_be0 + 0x10),__l_18,&local_c8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_cc8,"12,34,567,,",&local_cc9);
  phosg::split_context(&local_ca8,&local_cc8,',',0);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_be0 + 0x10),&local_ca8);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"34\", \"567\", \"\", \"\"}) != split_context(\"12,34,567,,\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x235);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_ca8);
  std::__cxx11::string::~string((string *)&local_cc8);
  std::allocator<char>::~allocator(&local_cc9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_be0 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_c8f);
  local_2a60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be0;
  do {
    local_2a60 = local_2a60 + -1;
    std::__cxx11::string::~string((string *)local_2a60);
  } while (local_2a60 != &local_c80);
  std::allocator<char>::~allocator(&local_c8d);
  std::allocator<char>::~allocator(&local_c8c);
  std::allocator<char>::~allocator(&local_c8b);
  std::allocator<char>::~allocator(&local_c8a);
  std::allocator<char>::~allocator(&local_c89);
  local_d22 = 1;
  local_d20 = &local_d18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d18,"",&local_d21);
  local_d22 = 0;
  local_cf8._0_8_ = &local_d18;
  local_cf8._8_8_ = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_d23);
  __l_17._M_len = local_cf8._8_8_;
  __l_17._M_array = (iterator)local_cf8._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_cf8 + 0x10),__l_17,&local_d23);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d60,"",&local_d61);
  phosg::split_context(&local_d40,&local_d60,',',0);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_cf8 + 0x10),&local_d40);
  phosg::expect_generic
            (bVar2,"vector<string>({\"\"}) != split_context(\"\", \',\')",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x236);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d40);
  std::__cxx11::string::~string((string *)&local_d60);
  std::allocator<char>::~allocator(&local_d61);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_cf8 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_d23);
  local_2aa0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cf8;
  do {
    local_2aa0 = local_2aa0 + -1;
    std::__cxx11::string::~string((string *)local_2aa0);
  } while (local_2aa0 != &local_d18);
  std::allocator<char>::~allocator(&local_d21);
  local_dfc = 1;
  local_df8 = &local_df0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_df0,"a",&local_df9);
  local_df8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dd0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_dd0,"b",&local_dfa);
  local_df8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_db0,"c d e f",&local_dfb);
  local_dfc = 0;
  local_d90._0_8_ = &local_df0;
  local_d90._8_8_ = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_dfd);
  __l_16._M_len = local_d90._8_8_;
  __l_16._M_array = (iterator)local_d90._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_d90 + 0x10),__l_16,&local_dfd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e38,"a b c d e f",&local_e39);
  phosg::split_context(&local_e18,&local_e38,' ',2);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_d90 + 0x10),&local_e18);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"a\", \"b\", \"c d e f\"}) != split_context(\"a b c d e f\", \' \', 2)"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x237);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e18);
  std::__cxx11::string::~string((string *)&local_e38);
  std::allocator<char>::~allocator(&local_e39);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_d90 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_dfd);
  local_2b00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d90;
  do {
    local_2b00 = local_2b00 + -1;
    std::__cxx11::string::~string((string *)local_2b00);
  } while (local_2b00 != &local_df0);
  std::allocator<char>::~allocator(&local_dfb);
  std::allocator<char>::~allocator(&local_dfa);
  std::allocator<char>::~allocator(&local_df9);
  local_ef5 = 1;
  local_ef0 = &local_ee8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ee8,"12",&local_ef1);
  local_ef0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ec8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ec8,"3(4,56)7",&local_ef2);
  local_ef0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ea8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ea8,"ab[c,]d",&local_ef3);
  local_ef0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e88,"e{fg(h,),}",&local_ef4);
  local_ef5 = 0;
  local_e68._0_8_ = &local_ee8;
  local_e68._8_8_ = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_ef6);
  __l_15._M_len = local_e68._8_8_;
  __l_15._M_array = (iterator)local_e68._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_e68 + 0x10),__l_15,&local_ef6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f30,"12,3(4,56)7,ab[c,]d,e{fg(h,),}",&local_f31);
  phosg::split_context(&local_f10,&local_f30,',',0);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_e68 + 0x10),&local_f10);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"3(4,56)7\", \"ab[c,]d\", \"e{fg(h,),}\"}) != split_context(\"12,3(4,56)7,ab[c,]d,e{fg(h,),}\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x239);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f10);
  std::__cxx11::string::~string((string *)&local_f30);
  std::allocator<char>::~allocator(&local_f31);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_e68 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_ef6);
  local_2b70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e68;
  do {
    local_2b70 = local_2b70 + -1;
    std::__cxx11::string::~string((string *)local_2b70);
  } while (local_2b70 != &local_ee8);
  std::allocator<char>::~allocator(&local_ef4);
  std::allocator<char>::~allocator(&local_ef3);
  std::allocator<char>::~allocator(&local_ef2);
  std::allocator<char>::~allocator(&local_ef1);
  local_fcc = 1;
  local_fc8 = &local_fc0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fc0,"12",&local_fc9);
  local_fc8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_fa0,"(34,567)",&local_fca);
  local_fc8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f80,"abc",&local_fcb);
  local_fcc = 0;
  local_f60._0_8_ = &local_fc0;
  local_f60._8_8_ = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_fcd);
  __l_14._M_len = local_f60._8_8_;
  __l_14._M_array = (iterator)local_f60._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_f60 + 0x10),__l_14,&local_fcd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1008,"12,(34,567),abc",&local_1009);
  phosg::split_context(&local_fe8,&local_1008,',',0);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_f60 + 0x10),&local_fe8);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"(34,567)\", \"abc\"}) != split_context(\"12,(34,567),abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_fe8);
  std::__cxx11::string::~string((string *)&local_1008);
  std::allocator<char>::~allocator(&local_1009);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_f60 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_fcd);
  local_2bd0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f60;
  do {
    local_2bd0 = local_2bd0 + -1;
    std::__cxx11::string::~string((string *)local_2bd0);
  } while (local_2bd0 != &local_fc0);
  std::allocator<char>::~allocator(&local_fcb);
  std::allocator<char>::~allocator(&local_fca);
  std::allocator<char>::~allocator(&local_fc9);
  local_1083 = 1;
  local_1080 = &local_1078;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1078,"12(,(34),567)",&local_1081);
  local_1080 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1058;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1058,"abc",&local_1082);
  local_1083 = 0;
  local_1038._0_8_ = &local_1078;
  local_1038._8_8_ = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1084);
  __l_13._M_len = local_1038._8_8_;
  __l_13._M_array = (iterator)local_1038._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_1038 + 0x10),__l_13,&local_1084);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10c0,"12(,(34),567),abc",&local_10c1);
  phosg::split_context(&local_10a0,&local_10c0,',',0);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_1038 + 0x10),&local_10a0);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12(,(34),567)\", \"abc\"}) != split_context(\"12(,(34),567),abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_10a0);
  std::__cxx11::string::~string((string *)&local_10c0);
  std::allocator<char>::~allocator(&local_10c1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1038 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1084);
  local_2c20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1038;
  do {
    local_2c20 = local_2c20 + -1;
    std::__cxx11::string::~string((string *)local_2c20);
  } while (local_2c20 != &local_1078);
  std::allocator<char>::~allocator(&local_1082);
  std::allocator<char>::~allocator(&local_1081);
  local_115c = 1;
  local_1158 = &local_1150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1150,"12",&local_1159);
  local_1158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1130,"(,567)",&local_115a);
  local_1158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1110,"abc",&local_115b);
  local_115c = 0;
  local_10f0._0_8_ = &local_1150;
  local_10f0._8_8_ = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_115d);
  __l_12._M_len = local_10f0._8_8_;
  __l_12._M_array = (iterator)local_10f0._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_10f0 + 0x10),__l_12,&local_115d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1198,"12,(,567),abc",&local_1199);
  phosg::split_context(&local_1178,&local_1198,',',0);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_10f0 + 0x10),&local_1178);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"(,567)\", \"abc\"}) != split_context(\"12,(,567),abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1178);
  std::__cxx11::string::~string((string *)&local_1198);
  std::allocator<char>::~allocator(&local_1199);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_10f0 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_115d);
  local_2c80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10f0;
  do {
    local_2c80 = local_2c80 + -1;
    std::__cxx11::string::~string((string *)local_2c80);
  } while (local_2c80 != &local_1150);
  std::allocator<char>::~allocator(&local_115b);
  std::allocator<char>::~allocator(&local_115a);
  std::allocator<char>::~allocator(&local_1159);
  local_1234 = 1;
  local_1230 = &local_1228;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1228,"12",&local_1231);
  local_1230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1208;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1208,"(34,)",&local_1232);
  local_1230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_11e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_11e8,"abc",&local_1233);
  local_1234 = 0;
  local_11c8._0_8_ = &local_1228;
  local_11c8._8_8_ = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1235);
  __l_11._M_len = local_11c8._8_8_;
  __l_11._M_array = (iterator)local_11c8._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_11c8 + 0x10),__l_11,&local_1235);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1270,"12,(34,),abc",&local_1271);
  phosg::split_context(&local_1250,&local_1270,',',0);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_11c8 + 0x10),&local_1250);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"(34,)\", \"abc\"}) != split_context(\"12,(34,),abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1250);
  std::__cxx11::string::~string((string *)&local_1270);
  std::allocator<char>::~allocator(&local_1271);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_11c8 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1235);
  local_2ce0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_11c8;
  do {
    local_2ce0 = local_2ce0 + -1;
    std::__cxx11::string::~string((string *)local_2ce0);
  } while (local_2ce0 != &local_1228);
  std::allocator<char>::~allocator(&local_1233);
  std::allocator<char>::~allocator(&local_1232);
  std::allocator<char>::~allocator(&local_1231);
  local_130c = 1;
  local_1308 = &local_1300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1300,"12",&local_1309);
  local_1308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_12e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_12e0,"(,)",&local_130a);
  local_1308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_12c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_12c0,"abc",&local_130b);
  local_130c = 0;
  local_12a0._0_8_ = &local_1300;
  local_12a0._8_8_ = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_130d);
  __l_10._M_len = local_12a0._8_8_;
  __l_10._M_array = (iterator)local_12a0._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_12a0 + 0x10),__l_10,&local_130d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1348,"12,(,),abc",&local_1349)
  ;
  phosg::split_context(&local_1328,&local_1348,',',0);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_12a0 + 0x10),&local_1328);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"(,)\", \"abc\"}) != split_context(\"12,(,),abc\", \',\')",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1328);
  std::__cxx11::string::~string((string *)&local_1348);
  std::allocator<char>::~allocator(&local_1349);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_12a0 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_130d);
  local_2d40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_12a0;
  do {
    local_2d40 = local_2d40 + -1;
    std::__cxx11::string::~string((string *)local_2d40);
  } while (local_2d40 != &local_1300);
  std::allocator<char>::~allocator(&local_130b);
  std::allocator<char>::~allocator(&local_130a);
  std::allocator<char>::~allocator(&local_1309);
  local_13c3 = 1;
  local_13c0 = &local_13b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_13b8,"12",&local_13c1);
  local_13c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1398;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1398,"(34,567),abc",&local_13c2);
  local_13c3 = 0;
  local_1378._0_8_ = &local_13b8;
  local_1378._8_8_ = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_13c4);
  __l_09._M_len = local_1378._8_8_;
  __l_09._M_array = (iterator)local_1378._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_1378 + 0x10),__l_09,&local_13c4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1400,"12,(34,567),abc",&local_1401);
  phosg::split_context(&local_13e0,&local_1400,',',1);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_1378 + 0x10),&local_13e0);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"(34,567),abc\"}) != split_context(\"12,(34,567),abc\", \',\', 1)"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_13e0);
  std::__cxx11::string::~string((string *)&local_1400);
  std::allocator<char>::~allocator(&local_1401);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1378 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_13c4);
  local_2d90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1378;
  do {
    local_2d90 = local_2d90 + -1;
    std::__cxx11::string::~string((string *)local_2d90);
  } while (local_2d90 != &local_13b8);
  std::allocator<char>::~allocator(&local_13c2);
  std::allocator<char>::~allocator(&local_13c1);
  local_147b = 1;
  local_1478 = &local_1470;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1470,"(12,34)",&local_1479);
  local_1478 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1450;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1450,"567,abc",&local_147a);
  local_147b = 0;
  local_1430._0_8_ = &local_1470;
  local_1430._8_8_ = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_147c);
  __l_08._M_len = local_1430._8_8_;
  __l_08._M_array = (iterator)local_1430._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_1430 + 0x10),__l_08,&local_147c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14b8,"(12,34),567,abc",&local_14b9);
  phosg::split_context(&local_1498,&local_14b8,',',1);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_1430 + 0x10),&local_1498);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"(12,34)\", \"567,abc\"}) != split_context(\"(12,34),567,abc\", \',\', 1)"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x240);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1498);
  std::__cxx11::string::~string((string *)&local_14b8);
  std::allocator<char>::~allocator(&local_14b9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1430 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_147c);
  local_2de0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1430;
  do {
    local_2de0 = local_2de0 + -1;
    std::__cxx11::string::~string((string *)local_2de0);
  } while (local_2de0 != &local_1470);
  std::allocator<char>::~allocator(&local_147a);
  std::allocator<char>::~allocator(&local_1479);
  fprintf(_stderr,"-- split_args\n");
  local_14d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_14d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_14d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1510,"",&local_1511);
  phosg::split_args(&local_14f0,&local_1510);
  bVar2 = std::operator==(&local_14d8,&local_14f0);
  phosg::expect_generic
            (bVar2,"vector<string>() != split_args(\"\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x245);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_14f0);
  std::__cxx11::string::~string((string *)&local_1510);
  std::allocator<char>::~allocator(&local_1511);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_14d8);
  local_1538.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1538.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1538.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1538);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1570,"      ",&local_1571);
  phosg::split_args(&local_1550,&local_1570);
  bVar2 = std::operator==(&local_1538,&local_1550);
  phosg::expect_generic
            (bVar2,"vector<string>() != split_args(\"      \")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x246);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1550);
  std::__cxx11::string::~string((string *)&local_1570);
  std::allocator<char>::~allocator(&local_1571);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1538);
  local_162d = 1;
  local_1628 = &local_1620;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1620,"12",&local_1629);
  local_1628 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1600;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1600,"34",&local_162a);
  local_1628 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_15e0,"567",&local_162b);
  local_1628 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_15c0,"abc",&local_162c);
  local_162d = 0;
  local_15a0._0_8_ = &local_1620;
  local_15a0._8_8_ = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_162e);
  __l_07._M_len = local_15a0._8_8_;
  __l_07._M_array = (iterator)local_15a0._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_15a0 + 0x10),__l_07,&local_162e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1668,"12 34 567 abc",&local_1669);
  phosg::split_args(&local_1648,&local_1668);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_15a0 + 0x10),&local_1648);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"34\", \"567\", \"abc\"}) != split_args(\"12 34 567 abc\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x247);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1648);
  std::__cxx11::string::~string((string *)&local_1668);
  std::allocator<char>::~allocator(&local_1669);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_15a0 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_162e);
  local_2e70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15a0;
  do {
    local_2e70 = local_2e70 + -1;
    std::__cxx11::string::~string((string *)local_2e70);
  } while (local_2e70 != &local_1620);
  std::allocator<char>::~allocator(&local_162c);
  std::allocator<char>::~allocator(&local_162b);
  std::allocator<char>::~allocator(&local_162a);
  std::allocator<char>::~allocator(&local_1629);
  local_1704 = 1;
  local_1700 = &local_16f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_16f8,"12",&local_1701);
  local_1700 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_16d8,"34 567",&local_1702);
  local_1700 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_16b8,"abc",&local_1703);
  local_1704 = 0;
  local_1698._0_8_ = &local_16f8;
  local_1698._8_8_ = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1705);
  __l_06._M_len = local_1698._8_8_;
  __l_06._M_array = (iterator)local_1698._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_1698 + 0x10),__l_06,&local_1705);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1740,"12 \'34 567\' abc",&local_1741);
  phosg::split_args(&local_1720,&local_1740);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_1698 + 0x10),&local_1720);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"34 567\", \"abc\"}) != split_args(\"12 \\\'34 567\\\' abc\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1720);
  std::__cxx11::string::~string((string *)&local_1740);
  std::allocator<char>::~allocator(&local_1741);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1698 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1705);
  local_2ed0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1698;
  do {
    local_2ed0 = local_2ed0 + -1;
    std::__cxx11::string::~string((string *)local_2ed0);
  } while (local_2ed0 != &local_16f8);
  std::allocator<char>::~allocator(&local_1703);
  std::allocator<char>::~allocator(&local_1702);
  std::allocator<char>::~allocator(&local_1701);
  local_17dc = 1;
  local_17d8 = &local_17d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_17d0,"12",&local_17d9);
  local_17d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_17b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_17b0,"34 567",&local_17da);
  local_17d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1790;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1790,"abc",&local_17db);
  local_17dc = 0;
  local_1770._0_8_ = &local_17d0;
  local_1770._8_8_ = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_17dd);
  __l_05._M_len = local_1770._8_8_;
  __l_05._M_array = (iterator)local_1770._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_1770 + 0x10),__l_05,&local_17dd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1818,"12 \"34 567\" abc",&local_1819);
  phosg::split_args(&local_17f8,&local_1818);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_1770 + 0x10),&local_17f8);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"34 567\", \"abc\"}) != split_args(\"12 \\\"34 567\\\" abc\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x249);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_17f8);
  std::__cxx11::string::~string((string *)&local_1818);
  std::allocator<char>::~allocator(&local_1819);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1770 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_17dd);
  local_2f30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1770;
  do {
    local_2f30 = local_2f30 + -1;
    std::__cxx11::string::~string((string *)local_2f30);
  } while (local_2f30 != &local_17d0);
  std::allocator<char>::~allocator(&local_17db);
  std::allocator<char>::~allocator(&local_17da);
  std::allocator<char>::~allocator(&local_17d9);
  local_18b4 = 1;
  local_18b0 = &local_18a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_18a8,"12",&local_18b1);
  local_18b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1888;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1888,"34 \'567",&local_18b2);
  local_18b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1868;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1868,"abc",&local_18b3);
  local_18b4 = 0;
  local_1848._0_8_ = &local_18a8;
  local_1848._8_8_ = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_18b5);
  __l_04._M_len = local_1848._8_8_;
  __l_04._M_array = (iterator)local_1848._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_1848 + 0x10),__l_04,&local_18b5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_18f0,"12 \'34 \\\'567\' abc",&local_18f1);
  phosg::split_args(&local_18d0,&local_18f0);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_1848 + 0x10),&local_18d0);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"34 \\\'567\", \"abc\"}) != split_args(\"12 \\\'34 \\\\\\\'567\\\' abc\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x24a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_18d0);
  std::__cxx11::string::~string((string *)&local_18f0);
  std::allocator<char>::~allocator(&local_18f1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1848 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_18b5);
  local_2f90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1848;
  do {
    local_2f90 = local_2f90 + -1;
    std::__cxx11::string::~string((string *)local_2f90);
  } while (local_2f90 != &local_18a8);
  std::allocator<char>::~allocator(&local_18b3);
  std::allocator<char>::~allocator(&local_18b2);
  std::allocator<char>::~allocator(&local_18b1);
  local_198c = 1;
  local_1988 = &local_1980;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1980,"12",&local_1989);
  local_1988 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1960;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1960,"34 \"567",&local_198a);
  local_1988 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1940;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1940,"abc",&local_198b);
  local_198c = 0;
  local_1920._0_8_ = &local_1980;
  local_1920._8_8_ = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_198d);
  __l_03._M_len = local_1920._8_8_;
  __l_03._M_array = (iterator)local_1920._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_1920 + 0x10),__l_03,&local_198d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_19c8,"12 \"34 \\\"567\" abc",&local_19c9);
  phosg::split_args(&local_19a8,&local_19c8);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_1920 + 0x10),&local_19a8);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"34 \\\"567\", \"abc\"}) != split_args(\"12 \\\"34 \\\\\\\"567\\\" abc\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x24b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_19a8);
  std::__cxx11::string::~string((string *)&local_19c8);
  std::allocator<char>::~allocator(&local_19c9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1920 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_198d);
  local_2ff0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1920;
  do {
    local_2ff0 = local_2ff0 + -1;
    std::__cxx11::string::~string((string *)local_2ff0);
  } while (local_2ff0 != &local_1980);
  std::allocator<char>::~allocator(&local_198b);
  std::allocator<char>::~allocator(&local_198a);
  std::allocator<char>::~allocator(&local_1989);
  local_1a64 = 1;
  local_1a60 = &local_1a58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a58,"12",&local_1a61);
  local_1a60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a38,"34 567",&local_1a62);
  local_1a60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a18,"abc",&local_1a63);
  local_1a64 = 0;
  local_19f8._0_8_ = &local_1a58;
  local_19f8._8_8_ = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1a65);
  __l_02._M_len = local_19f8._8_8_;
  __l_02._M_array = (iterator)local_19f8._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_19f8 + 0x10),__l_02,&local_1a65);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1aa0,"12 34\\ 567 abc",&local_1aa1);
  phosg::split_args(&local_1a80,&local_1aa0);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_19f8 + 0x10),&local_1a80);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"34 567\", \"abc\"}) != split_args(\"12 34\\\\ 567 abc\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x24c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a80);
  std::__cxx11::string::~string((string *)&local_1aa0);
  std::allocator<char>::~allocator(&local_1aa1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_19f8 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1a65);
  local_3050 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_19f8;
  do {
    local_3050 = local_3050 + -1;
    std::__cxx11::string::~string((string *)local_3050);
  } while (local_3050 != &local_1a58);
  std::allocator<char>::~allocator(&local_1a63);
  std::allocator<char>::~allocator(&local_1a62);
  std::allocator<char>::~allocator(&local_1a61);
  local_1b3c = 1;
  local_1b38 = &local_1b30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b30,"12",&local_1b39);
  local_1b38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b10,"34 567",&local_1b3a);
  local_1b38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1af0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1af0,"abc",&local_1b3b);
  local_1b3c = 0;
  local_1ad0._0_8_ = &local_1b30;
  local_1ad0._8_8_ = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1b3d);
  __l_01._M_len = local_1ad0._8_8_;
  __l_01._M_array = (iterator)local_1ad0._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_1ad0 + 0x10),__l_01,&local_1b3d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b78,"   12 34\\ 567 abc   ",&local_1b79);
  phosg::split_args(&local_1b58,&local_1b78);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_1ad0 + 0x10),&local_1b58);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"34 567\", \"abc\"}) != split_args(\"   12 34\\\\ 567 abc   \")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x24d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b58);
  std::__cxx11::string::~string((string *)&local_1b78);
  std::allocator<char>::~allocator(&local_1b79);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1ad0 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1b3d);
  local_30b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1ad0;
  do {
    local_30b0 = local_30b0 + -1;
    std::__cxx11::string::~string((string *)local_30b0);
  } while (local_30b0 != &local_1b30);
  std::allocator<char>::~allocator(&local_1b3b);
  std::allocator<char>::~allocator(&local_1b3a);
  std::allocator<char>::~allocator(&local_1b39);
  local_1c35 = 1;
  local_1c30 = &local_1c28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c28,"12",&local_1c31);
  local_1c30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c08,"34 567",&local_1c32);
  local_1c30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1be8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1be8,"abc",&local_1c33);
  local_1c30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1bc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1bc8," ",&local_1c34);
  local_1c35 = 0;
  local_1ba8._0_8_ = &local_1c28;
  local_1ba8._8_8_ = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1c36);
  __l_00._M_len = local_1ba8._8_8_;
  __l_00._M_array = (iterator)local_1ba8._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_1ba8 + 0x10),__l_00,&local_1c36);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c70,"   12 34\\ 567 abc  \\   ",&local_1c71);
  phosg::split_args(&local_1c50,&local_1c70);
  bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_1ba8 + 0x10),&local_1c50);
  phosg::expect_generic
            (bVar2,
             "vector<string>({\"12\", \"34 567\", \"abc\", \" \"}) != split_args(\"   12 34\\\\ 567 abc  \\\\   \")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x24e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c50);
  std::__cxx11::string::~string((string *)&local_1c70);
  std::allocator<char>::~allocator(&local_1c71);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1ba8 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1c36);
  local_3120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1ba8;
  do {
    local_3120 = local_3120 + -1;
    std::__cxx11::string::~string((string *)local_3120);
  } while (local_3120 != &local_1c28);
  std::allocator<char>::~allocator(&local_1c34);
  std::allocator<char>::~allocator(&local_1c33);
  std::allocator<char>::~allocator(&local_1c32);
  std::allocator<char>::~allocator(&local_1c31);
  fprintf(_stderr,"-- skip_whitespace/skip_non_whitespace\n");
  sVar5 = phosg::skip_whitespace("1234",0);
  phosg::expect_generic
            (sVar5 == 0,"0 != skip_whitespace(\"1234\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x252);
  sVar5 = phosg::skip_whitespace("  1234",0);
  phosg::expect_generic
            (sVar5 == 2,"2 != skip_whitespace(\"  1234\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x253);
  sVar5 = phosg::skip_whitespace("  \t\r\n  1234",0);
  phosg::expect_generic
            (sVar5 == 7,"7 != skip_whitespace(\"  \\t\\r\\n  1234\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x254);
  sVar5 = phosg::skip_whitespace("  \t\r\n  1234",3);
  phosg::expect_generic
            (sVar5 == 7,"7 != skip_whitespace(\"  \\t\\r\\n  1234\", 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x255);
  sVar5 = phosg::skip_whitespace("  \t\r\n  ",0);
  phosg::expect_generic
            (sVar5 == 7,"7 != skip_whitespace(\"  \\t\\r\\n  \", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x256);
  sVar5 = phosg::skip_whitespace("  \t\r\n  ",3);
  phosg::expect_generic
            (sVar5 == 7,"7 != skip_whitespace(\"  \\t\\r\\n  \", 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c98,"1234",&local_1c99);
  sVar5 = phosg::skip_whitespace(&local_1c98,0);
  phosg::expect_generic
            (sVar5 == 0,"0 != skip_whitespace(string(\"1234\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,600);
  std::__cxx11::string::~string((string *)&local_1c98);
  std::allocator<char>::~allocator(&local_1c99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1cc0,"  1234",&local_1cc1);
  sVar5 = phosg::skip_whitespace(&local_1cc0,0);
  phosg::expect_generic
            (sVar5 == 2,"2 != skip_whitespace(string(\"  1234\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x259);
  std::__cxx11::string::~string((string *)&local_1cc0);
  std::allocator<char>::~allocator(&local_1cc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ce8,"  \t\r\n  1234",&local_1ce9);
  sVar5 = phosg::skip_whitespace(&local_1ce8,0);
  phosg::expect_generic
            (sVar5 == 7,"7 != skip_whitespace(string(\"  \\t\\r\\n  1234\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25a);
  std::__cxx11::string::~string((string *)&local_1ce8);
  std::allocator<char>::~allocator(&local_1ce9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d10,"  \t\r\n  1234",&local_1d11);
  sVar5 = phosg::skip_whitespace(&local_1d10,3);
  phosg::expect_generic
            (sVar5 == 7,"7 != skip_whitespace(string(\"  \\t\\r\\n  1234\"), 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25b);
  std::__cxx11::string::~string((string *)&local_1d10);
  std::allocator<char>::~allocator(&local_1d11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d38,"  \t\r\n  ",&local_1d39)
  ;
  sVar5 = phosg::skip_whitespace(&local_1d38,0);
  phosg::expect_generic
            (sVar5 == 7,"7 != skip_whitespace(string(\"  \\t\\r\\n  \"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25c);
  std::__cxx11::string::~string((string *)&local_1d38);
  std::allocator<char>::~allocator(&local_1d39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d60,"  \t\r\n  ",&local_1d61)
  ;
  sVar5 = phosg::skip_whitespace(&local_1d60,3);
  phosg::expect_generic
            (sVar5 == 7,"7 != skip_whitespace(string(\"  \\t\\r\\n  \"), 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25d);
  std::__cxx11::string::~string((string *)&local_1d60);
  std::allocator<char>::~allocator(&local_1d61);
  sVar5 = phosg::skip_non_whitespace("1234 ",0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234 \", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25e);
  sVar5 = phosg::skip_non_whitespace("1234 ",2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234 \", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25f);
  sVar5 = phosg::skip_non_whitespace("1234\t",0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234\\t\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x260);
  sVar5 = phosg::skip_non_whitespace("1234\t",2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234\\t\", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x261);
  sVar5 = phosg::skip_non_whitespace("1234\r",0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234\\r\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x262);
  sVar5 = phosg::skip_non_whitespace("1234\r",2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234\\r\", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x263);
  sVar5 = phosg::skip_non_whitespace("1234\n",0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234\\n\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x264);
  sVar5 = phosg::skip_non_whitespace("1234\n",2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234\\n\", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x265);
  sVar5 = phosg::skip_non_whitespace("1234",0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x266);
  sVar5 = phosg::skip_non_whitespace("1234",2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234\", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x267);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d88,"1234 ",&local_1d89);
  sVar5 = phosg::skip_non_whitespace(&local_1d88,0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234 \"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x268);
  std::__cxx11::string::~string((string *)&local_1d88);
  std::allocator<char>::~allocator(&local_1d89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1db0,"1234 ",&local_1db1);
  sVar5 = phosg::skip_non_whitespace(&local_1db0,2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234 \"), 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x269);
  std::__cxx11::string::~string((string *)&local_1db0);
  std::allocator<char>::~allocator(&local_1db1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1dd8,"1234\t",&local_1dd9);
  sVar5 = phosg::skip_non_whitespace(&local_1dd8,0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234\\t\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26a);
  std::__cxx11::string::~string((string *)&local_1dd8);
  std::allocator<char>::~allocator(&local_1dd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e00,"1234\t",&local_1e01);
  sVar5 = phosg::skip_non_whitespace(&local_1e00,2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234\\t\"), 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26b);
  std::__cxx11::string::~string((string *)&local_1e00);
  std::allocator<char>::~allocator(&local_1e01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e28,"1234\r",&local_1e29);
  sVar5 = phosg::skip_non_whitespace(&local_1e28,0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234\\r\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26c);
  std::__cxx11::string::~string((string *)&local_1e28);
  std::allocator<char>::~allocator(&local_1e29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e50,"1234\r",&local_1e51);
  sVar5 = phosg::skip_non_whitespace(&local_1e50,2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234\\r\"), 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26d);
  std::__cxx11::string::~string((string *)&local_1e50);
  std::allocator<char>::~allocator(&local_1e51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e78,"1234\n",&local_1e79);
  sVar5 = phosg::skip_non_whitespace(&local_1e78,0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234\\n\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26e);
  std::__cxx11::string::~string((string *)&local_1e78);
  std::allocator<char>::~allocator(&local_1e79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ea0,"1234\n",&local_1ea1);
  sVar5 = phosg::skip_non_whitespace(&local_1ea0,2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234\\n\"), 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26f);
  std::__cxx11::string::~string((string *)&local_1ea0);
  std::allocator<char>::~allocator(&local_1ea1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ec8,"1234",&local_1ec9);
  sVar5 = phosg::skip_non_whitespace(&local_1ec8,0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x270);
  std::__cxx11::string::~string((string *)&local_1ec8);
  std::allocator<char>::~allocator(&local_1ec9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ef0,"1234",(allocator<char> *)((long)&sentence + 7));
  sVar5 = phosg::skip_non_whitespace(&local_1ef0,2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234\"), 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x271);
  std::__cxx11::string::~string((string *)&local_1ef0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&sentence + 7));
  fprintf(_stderr,"-- skip_word\n");
  expected_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_136d;
  local_1f78[6] = 0x24;
  local_1f78[7] = 0x29;
  local_1f78[4] = 0x1b;
  local_1f78[5] = 0x20;
  local_1f78[2] = 0x10;
  local_1f78[3] = 0x14;
  local_1f78[0] = 4;
  local_1f78[1] = 10;
  local_1f78[8] = 0x2d;
  local_1f28 = local_1f78;
  local_1f20 = 9;
  this = (allocator<unsigned_long> *)
         ((long)&offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(this);
  __l._M_len = local_1f20;
  __l._M_array = local_1f28;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f18,__l,this);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&offset);
  sentence_str.field_2._8_8_ = 0;
  while (*(char *)((long)expected_offsets.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + sentence_str.field_2._8_8_) !=
         '\0') {
    sentence_str.field_2._8_8_ =
         phosg::skip_word((char *)expected_offsets.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                          sentence_str.field_2._8_8_);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&offset,
               (unsigned_long *)(sentence_str.field_2._M_local_buf + 8));
  }
  bVar2 = std::operator==((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f18,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&offset);
  phosg::expect_generic
            (bVar2,"expected_offsets != offsets",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x27d);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&offset);
  __s = expected_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1fc0,(char *)__s,
             (allocator<char> *)
             ((long)&offsets_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&offsets_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&offset_1);
  input.field_2._8_8_ = 0;
  while( true ) {
    pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1fc0,input.field_2._8_8_);
    if (*pvVar6 == '\0') break;
    input.field_2._8_8_ = phosg::skip_word((string *)local_1fc0,input.field_2._8_8_);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&offset_1,
               (unsigned_long *)(input.field_2._M_local_buf + 8));
  }
  bVar2 = std::operator==((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f18,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&offset_1);
  phosg::expect_generic
            (bVar2,"expected_offsets != offsets",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x287);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&offset_1);
  std::__cxx11::string::~string((string *)local_1fc0);
  fprintf(_stderr,"-- parse_data_string/format_data_string with arbitrary data\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2008,
             "/* omit 01 02 */ 03 ?04? $ ##30 $ ##127 ?\"dark\"? ###-1 \'cold\' %-1.667 %%-2.667",
             (allocator<char> *)(expected_data.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(expected_data.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_2030,"\x03\x04",0x22,
             (allocator<char> *)(expected_mask.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(expected_mask.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_2058,anon_var_dwarf_13c1,0x22,
             (allocator<char> *)(output_mask.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(output_mask.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(output_data.field_2._M_local_buf + 8));
  phosg::parse_data_string
            ((string *)((long)&expected_formatted_input.field_2 + 8),(string *)local_2008,
             (string *)(output_data.field_2._M_local_buf + 8),0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2030,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&expected_formatted_input.field_2 + 8));
  phosg::expect_generic
            (_Var3,"expected_data != output_data",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x29a);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2058,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&output_data.field_2 + 8));
  phosg::expect_generic
            (_Var3,"expected_mask != output_mask",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x29b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_20c0,
             "03?04?001E7F00?6461726B?FFFFFFFF63006F006C0064004260D5BFBC749318045605C0",
             (allocator<char> *)(formatted_input.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(formatted_input.field_2._M_local_buf + 0xf));
  phosg::format_data_string
            ((string *)local_20e8,(string *)((long)&expected_formatted_input.field_2 + 8),
             (string *)((long)&output_data.field_2 + 8),0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_20c0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_20e8);
  phosg::expect_generic
            (_Var3,"expected_formatted_input != formatted_input",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2a0);
  phosg::parse_data_string
            ((string *)((long)&expected_formatted_input_1.field_2 + 8),(string *)local_2008,
             (string *)((long)&output_data.field_2 + 8),0);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&expected_formatted_input.field_2 + 8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (pbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (expected_formatted_input_1.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(expected_formatted_input_1.field_2._M_local_buf + 8));
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2030,pbVar1);
  phosg::expect_generic
            (_Var3,"expected_data != output_data",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2a3);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2058,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&output_data.field_2 + 8));
  phosg::expect_generic
            (_Var3,"expected_mask != output_mask",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2a4);
  std::__cxx11::string::~string((string *)local_20e8);
  std::__cxx11::string::~string((string *)local_20c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2128,
             "0304001E7F006461726BFFFFFFFF63006F006C0064004260D5BFBC749318045605C0",
             (allocator<char> *)(formatted_input_1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(formatted_input_1.field_2._M_local_buf + 0xf));
  phosg::format_data_string
            ((string *)local_2150,(string *)((long)&expected_formatted_input.field_2 + 8),
             (string *)0x0,0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2128,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2150);
  phosg::expect_generic
            (_Var3,"expected_formatted_input != formatted_input",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2aa);
  phosg::parse_data_string
            ((string *)((long)&input_1.field_2 + 8),(string *)local_2008,
             (string *)((long)&output_data.field_2 + 8),0);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&expected_formatted_input.field_2 + 8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (pbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (input_1.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(input_1.field_2._M_local_buf + 8));
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2030,pbVar1);
  phosg::expect_generic
            (_Var3,"expected_data != output_data",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2ad);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2058,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&output_data.field_2 + 8));
  phosg::expect_generic
            (_Var3,"expected_mask != output_mask",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2ae);
  std::__cxx11::string::~string((string *)local_2150);
  std::__cxx11::string::~string((string *)local_2128);
  std::__cxx11::string::~string((string *)(expected_formatted_input.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(output_data.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_2058);
  std::__cxx11::string::~string((string *)local_2030);
  std::__cxx11::string::~string((string *)local_2008);
  fprintf(_stderr,"-- parse_data_string/format_data_string with printable data\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2190,
             "this is printable\nand it is sort of a haiku\nwith some control bytes\t\r\n",
             (allocator<char> *)(expected_formatted.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(expected_formatted.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_21b8,
             "\"this is printable\\nand it is sort of a haiku\\nwith some control bytes\\t\\r\\n\"",
             (allocator<char> *)(expected_formatted_hex.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(expected_formatted_hex.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_21e0,
             "74686973206973207072696E7461626C650A616E6420697420697320736F7274206F662061206861696B750A7769746820736F6D6520636F6E74726F6C206279746573090D0A"
             ,(allocator<char> *)(formatted.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(formatted.field_2._M_local_buf + 0xf));
  phosg::format_data_string((string *)local_2208,(string *)local_2190,(string *)0x0,0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_21b8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2208);
  phosg::expect_generic
            (_Var3,"expected_formatted != formatted",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2b8);
  phosg::parse_data_string
            ((string *)((long)&formatted_hex.field_2 + 8),(string *)local_2208,(string *)0x0,0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2190,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&formatted_hex.field_2 + 8));
  phosg::expect_generic
            (_Var3,"input != parse_data_string(formatted)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2b9);
  std::__cxx11::string::~string((string *)(formatted_hex.field_2._M_local_buf + 8));
  phosg::format_data_string((string *)local_2248,(string *)local_2190,(string *)0x0,1);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_21e0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2248);
  phosg::expect_generic
            (_Var3,"expected_formatted_hex != formatted_hex",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,699);
  phosg::parse_data_string
            ((string *)((long)&input_2.field_2 + 8),(string *)local_2248,(string *)0x0,0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2190,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&input_2.field_2 + 8));
  phosg::expect_generic
            (_Var3,"input != parse_data_string(formatted_hex)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,700);
  std::__cxx11::string::~string((string *)(input_2.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_2248);
  std::__cxx11::string::~string((string *)local_2208);
  std::__cxx11::string::~string((string *)local_21e0);
  std::__cxx11::string::~string((string *)local_21b8);
  std::__cxx11::string::~string((string *)local_2190);
  fprintf(_stderr,"-- parse_data_string/format_data_string with quotes in printable data\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2288,"this string has \"some\" \'quotes\'.",
             (allocator<char> *)(expected_formatted_1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(expected_formatted_1.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_22b0,"\"this string has \\\"some\\\" \\\'quotes\\\'.\"",
             (allocator<char> *)(formatted_1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(formatted_1.field_2._M_local_buf + 0xf));
  phosg::format_data_string((string *)local_22d8,(string *)local_2288,(string *)0x0,0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_22b0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_22d8);
  phosg::expect_generic
            (_Var3,"expected_formatted != formatted",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2c4);
  phosg::parse_data_string(&local_22f8,(string *)local_22d8,(string *)0x0,0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2288,&local_22f8);
  uVar7 = 0xc5;
  phosg::expect_generic
            (_Var3,"input != parse_data_string(formatted)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2c5);
  std::__cxx11::string::~string((string *)&local_22f8);
  std::__cxx11::string::~string((string *)local_22d8);
  std::__cxx11::string::~string((string *)local_22b0);
  std::__cxx11::string::~string((string *)local_2288);
  fprintf(_stderr,"-- format_size\n");
  phosg::format_size_abi_cxx11_(&local_2318,(phosg *)0x0,0,(bool)uVar7);
  bVar2 = std::operator==(&local_2318,"0 bytes");
  uVar7 = 0xca;
  phosg::expect_generic
            (bVar2,"\"0 bytes\" != format_size(0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2ca);
  std::__cxx11::string::~string((string *)&local_2318);
  phosg::format_size_abi_cxx11_(&local_2338,(phosg *)0x3e8,0,(bool)uVar7);
  bVar2 = std::operator==(&local_2338,"1000 bytes");
  uVar7 = 0xcb;
  phosg::expect_generic
            (bVar2,"\"1000 bytes\" != format_size(1000)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2cb);
  std::__cxx11::string::~string((string *)&local_2338);
  phosg::format_size_abi_cxx11_(&local_2358,(phosg *)0x600,0,(bool)uVar7);
  bVar2 = std::operator==(&local_2358,"1.50 KB");
  uVar7 = 0xcc;
  phosg::expect_generic
            (bVar2,"\"1.50 KB\" != format_size(1536)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2cc);
  std::__cxx11::string::~string((string *)&local_2358);
  phosg::format_size_abi_cxx11_(&local_2378,(phosg *)0x600,1,(bool)uVar7);
  bVar2 = std::operator==(&local_2378,"1536 bytes (1.50 KB)");
  uVar7 = 0xcd;
  phosg::expect_generic
            (bVar2,"\"1536 bytes (1.50 KB)\" != format_size(1536, true)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2cd);
  std::__cxx11::string::~string((string *)&local_2378);
  phosg::format_size_abi_cxx11_(&local_2398,(phosg *)0x40000000,0,(bool)uVar7);
  bVar2 = std::operator==(&local_2398,"1.00 GB");
  uVar7 = 0xce;
  phosg::expect_generic
            (bVar2,"\"1.00 GB\" != format_size(1073741824)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2ce);
  std::__cxx11::string::~string((string *)&local_2398);
  phosg::format_size_abi_cxx11_(&local_23b8,(phosg *)0x40000000,1,(bool)uVar7);
  bVar2 = std::operator==(&local_23b8,"1073741824 bytes (1.00 GB)");
  phosg::expect_generic
            (bVar2,"\"1073741824 bytes (1.00 GB)\" != format_size(1073741824, true)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2cf);
  std::__cxx11::string::~string((string *)&local_23b8);
  fprintf(_stderr,"-- parse_size\n");
  sVar5 = phosg::parse_size("0");
  phosg::expect_generic
            (sVar5 == 0,"0 != parse_size(\"0\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d4);
  sVar5 = phosg::parse_size("0B");
  phosg::expect_generic
            (sVar5 == 0,"0 != parse_size(\"0B\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d5);
  sVar5 = phosg::parse_size("0 B");
  phosg::expect_generic
            (sVar5 == 0,"0 != parse_size(\"0 B\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d6);
  sVar5 = phosg::parse_size("0 bytes");
  phosg::expect_generic
            (sVar5 == 0,"0 != parse_size(\"0 bytes\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d7);
  sVar5 = phosg::parse_size("1000 bytes");
  phosg::expect_generic
            (sVar5 == 1000,"1000 != parse_size(\"1000 bytes\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d8);
  sVar5 = phosg::parse_size("1.5 KB");
  phosg::expect_generic
            (sVar5 == 0x600,"1536 != parse_size(\"1.5 KB\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d9);
  sVar5 = phosg::parse_size("3 MB");
  phosg::expect_generic
            (sVar5 == 0x300000,"3 * 1024 * 1024 != parse_size(\"3 MB\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2da);
  fprintf(_stderr,"-- escape_quotes\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_23f8,"",&local_23f9);
  phosg::escape_quotes(&local_23d8,&local_23f8);
  bVar2 = std::operator==(&local_23d8,"");
  phosg::expect_generic
            (bVar2,"\"\" != escape_quotes(\"\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2df);
  std::__cxx11::string::~string((string *)&local_23d8);
  std::__cxx11::string::~string((string *)&local_23f8);
  std::allocator<char>::~allocator(&local_23f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2440,"omg hax",&local_2441);
  phosg::escape_quotes(&local_2420,&local_2440);
  bVar2 = std::operator==(&local_2420,"omg hax");
  phosg::expect_generic
            (bVar2,"\"omg hax\" != escape_quotes(\"omg hax\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e0);
  std::__cxx11::string::~string((string *)&local_2420);
  std::__cxx11::string::~string((string *)&local_2440);
  std::allocator<char>::~allocator(&local_2441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2488,"\'omg\' \"hax\"",&local_2489);
  phosg::escape_quotes(&local_2468,&local_2488);
  bVar2 = std::operator==(&local_2468,"\'omg\' \\\"hax\\\"");
  phosg::expect_generic
            (bVar2,
             "\"\\\'omg\\\' \\\\\\\"hax\\\\\\\"\" != escape_quotes(\"\\\'omg\\\' \\\"hax\\\"\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e1);
  std::__cxx11::string::~string((string *)&local_2468);
  std::__cxx11::string::~string((string *)&local_2488);
  std::allocator<char>::~allocator(&local_2489);
  fprintf(_stderr,"-- escape_url\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_24d0,"",&local_24d1);
  phosg::escape_url(&local_24b0,&local_24d0,false);
  bVar2 = std::operator==(&local_24b0,"");
  phosg::expect_generic
            (bVar2,"\"\" != escape_url(\"\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e6);
  std::__cxx11::string::~string((string *)&local_24b0);
  std::__cxx11::string::~string((string *)&local_24d0);
  std::allocator<char>::~allocator(&local_24d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2518,"omg hax",&local_2519);
  phosg::escape_url(&local_24f8,&local_2518,false);
  bVar2 = std::operator==(&local_24f8,"omg%20hax");
  phosg::expect_generic
            (bVar2,"\"omg%20hax\" != escape_url(\"omg hax\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e7);
  std::__cxx11::string::~string((string *)&local_24f8);
  std::__cxx11::string::~string((string *)&local_2518);
  std::allocator<char>::~allocator(&local_2519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2560,"slash/es",&local_2561);
  phosg::escape_url(&local_2540,&local_2560,false);
  bVar2 = std::operator==(&local_2540,"slash/es");
  phosg::expect_generic
            (bVar2,"\"slash/es\" != escape_url(\"slash/es\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e8);
  std::__cxx11::string::~string((string *)&local_2540);
  std::__cxx11::string::~string((string *)&local_2560);
  std::allocator<char>::~allocator(&local_2561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_25a8,"slash/es",&local_25a9);
  phosg::escape_url(&local_2588,&local_25a8,true);
  bVar2 = std::operator==(&local_2588,"slash%2Fes");
  phosg::expect_generic
            (bVar2,"\"slash%2Fes\" != escape_url(\"slash/es\", true)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e9);
  std::__cxx11::string::~string((string *)&local_2588);
  std::__cxx11::string::~string((string *)&local_25a8);
  std::allocator<char>::~allocator(&local_25a9);
  print_data_test();
  test_bit_reader();
  test_string_reader();
  unlink("StringsTest-data");
  printf("StringsTest: all tests passed\n");
  param_1_local._4_4_ = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f18);
  return param_1_local._4_4_;
}

Assistant:

int main(int, char**) {

  fprintf(stderr, "-- starts_with\n");
  expect(starts_with("abcdef", "abc"));
  expect(starts_with("abcdef", "abcdef"));
  expect(!starts_with("abcdef", "abcdefg"));
  expect(!starts_with("abcdef", "abd"));
  expect(!starts_with("abcdef", "dbc"));

  fprintf(stderr, "-- ends_with\n");
  expect(ends_with("abcdef", "def"));
  expect(ends_with("abcdef", "abcdef"));
  expect(!ends_with("abcdef", "gabcdef"));
  expect(!ends_with("abcdef", "ded"));
  expect(!ends_with("abcdef", "fef"));

  {
    fprintf(stderr, "-- str_replace_all\n");
    expect_eq("", str_replace_all(string(""), "def", "xyz"));
    expect_eq("abcdef", str_replace_all(string("abcdef"), "efg", "xyz"));
    expect_eq("abcxyz", str_replace_all(string("abcdef"), "def", "xyz"));
    expect_eq("abcxyzabc", str_replace_all(string("abcdefabc"), "def", "xyz"));
    expect_eq("abcxyzabcxyz", str_replace_all(string("abcdefabcdef"), "def", "xyz"));
    expect_eq("abcxyzabcxyzabc", str_replace_all(string("abcdefabcdefabc"), "def", "xyz"));
    expect_eq("xyzabcxyzabcxyzabc", str_replace_all(string("defabcdefabcdefabc"), "def", "xyz"));
  }

  {
    fprintf(stderr, "-- strip_trailing_zeroes\n");
    string s1("abcdef", 6);
    strip_trailing_zeroes(s1);
    expect_eq(s1, "abcdef");
    string s2("abcdef\0", 7);
    strip_trailing_zeroes(s2);
    expect_eq(s2, "abcdef");
    string s3("abcdef\0\0\0\0\0", 11);
    strip_trailing_zeroes(s3);
    expect_eq(s3, "abcdef");
    string s4("", 0);
    strip_trailing_zeroes(s4);
    expect_eq(s4, "");
    string s5("\0\0\0\0\0", 5);
    strip_trailing_zeroes(s5);
    expect_eq(s5, "");
  }

  {
    fprintf(stderr, "-- strip_trailing_whitespace\n");
    string s1 = "abcdef";
    strip_trailing_whitespace(s1);
    expect_eq(s1, "abcdef");
    string s2 = "abcdef\r\n";
    strip_trailing_whitespace(s2);
    expect_eq(s2, "abcdef");
    string s3 = "abc\tdef  \r\n";
    strip_trailing_whitespace(s3);
    expect_eq(s3, "abc\tdef");
    string s4 = "";
    strip_trailing_whitespace(s4);
    expect_eq(s4, "");
    string s5 = "   \t\r\n  ";
    strip_trailing_whitespace(s5);
    expect_eq(s5, "");
  }

  {
    fprintf(stderr, "-- strip_whitespace\n");

    string s = "abcdef";
    strip_whitespace(s);
    expect_eq(s, "abcdef");

    s = "abcdef\r\n";
    strip_whitespace(s);
    expect_eq(s, "abcdef");

    s = "  \nabc\tdef";
    strip_whitespace(s);
    expect_eq(s, "abc\tdef");

    s = "  \nabc\tdef  \r\n";
    strip_whitespace(s);
    expect_eq(s, "abc\tdef");

    s = "";
    strip_whitespace(s);
    expect_eq(s, "");

    s = "   \t\r\n  ";
    strip_whitespace(s);
    expect_eq(s, "");
  }

  {
    fprintf(stderr, "-- strip_multiline_comments\n");

    string s = "abc/*def*/ghi";
    strip_multiline_comments(s);
    expect_eq(s, "abcghi");

    s = "/*abc*/def\r\n";
    strip_multiline_comments(s);
    expect_eq(s, "def\r\n");

    s = "abc\n/*def\nghi*/\njkl";
    strip_multiline_comments(s);
    expect_eq(s, "abc\n\n\njkl");
  }

  {
    fprintf(stderr, "-- string_printf\n");
    string result = string_printf("%s %" PRIu64 " 0x%04hX", "lolz",
        static_cast<uint64_t>(1000), static_cast<uint16_t>(0x4F));
    fprintf(stderr, "%s\n", result.c_str());
    expect_eq("lolz 1000 0x004F", result);
  }

  {
    fprintf(stderr, "-- split\n");
    expect_eq(vector<string>({"12", "34", "567", "abc"}), split("12,34,567,abc", ','));
    expect_eq(vector<string>({"12", "34", "567", "", ""}), split("12,34,567,,", ','));
    expect_eq(vector<string>({""}), split("", ','));
    expect_eq(vector<string>({"a", "b", "c d e f"}), split("a b c d e f", ' ', 2));
  }

  {
    fprintf(stderr, "-- split_context\n");
    expect_eq(vector<string>({"12", "34", "567", "abc"}), split_context("12,34,567,abc", ','));
    expect_eq(vector<string>({"12", "34", "567", "", ""}), split_context("12,34,567,,", ','));
    expect_eq(vector<string>({""}), split_context("", ','));
    expect_eq(vector<string>({"a", "b", "c d e f"}), split_context("a b c d e f", ' ', 2));
    expect_eq(vector<string>({"12", "3(4,56)7", "ab[c,]d", "e{fg(h,),}"}),
        split_context("12,3(4,56)7,ab[c,]d,e{fg(h,),}", ','));
    expect_eq(vector<string>({"12", "(34,567)", "abc"}), split_context("12,(34,567),abc", ','));
    expect_eq(vector<string>({"12(,(34),567)", "abc"}), split_context("12(,(34),567),abc", ','));
    expect_eq(vector<string>({"12", "(,567)", "abc"}), split_context("12,(,567),abc", ','));
    expect_eq(vector<string>({"12", "(34,)", "abc"}), split_context("12,(34,),abc", ','));
    expect_eq(vector<string>({"12", "(,)", "abc"}), split_context("12,(,),abc", ','));
    expect_eq(vector<string>({"12", "(34,567),abc"}), split_context("12,(34,567),abc", ',', 1));
    expect_eq(vector<string>({"(12,34)", "567,abc"}), split_context("(12,34),567,abc", ',', 1));
  }

  {
    fprintf(stderr, "-- split_args\n");
    expect_eq(vector<string>(), split_args(""));
    expect_eq(vector<string>(), split_args("      "));
    expect_eq(vector<string>({"12", "34", "567", "abc"}), split_args("12 34 567 abc"));
    expect_eq(vector<string>({"12", "34 567", "abc"}), split_args("12 \'34 567\' abc"));
    expect_eq(vector<string>({"12", "34 567", "abc"}), split_args("12 \"34 567\" abc"));
    expect_eq(vector<string>({"12", "34 \'567", "abc"}), split_args("12 \'34 \\\'567\' abc"));
    expect_eq(vector<string>({"12", "34 \"567", "abc"}), split_args("12 \"34 \\\"567\" abc"));
    expect_eq(vector<string>({"12", "34 567", "abc"}), split_args("12 34\\ 567 abc"));
    expect_eq(vector<string>({"12", "34 567", "abc"}), split_args("   12 34\\ 567 abc   "));
    expect_eq(vector<string>({"12", "34 567", "abc", " "}), split_args("   12 34\\ 567 abc  \\   "));
  }

  fprintf(stderr, "-- skip_whitespace/skip_non_whitespace\n");
  expect_eq(0, skip_whitespace("1234", 0));
  expect_eq(2, skip_whitespace("  1234", 0));
  expect_eq(7, skip_whitespace("  \t\r\n  1234", 0));
  expect_eq(7, skip_whitespace("  \t\r\n  1234", 3));
  expect_eq(7, skip_whitespace("  \t\r\n  ", 0));
  expect_eq(7, skip_whitespace("  \t\r\n  ", 3));
  expect_eq(0, skip_whitespace(string("1234"), 0));
  expect_eq(2, skip_whitespace(string("  1234"), 0));
  expect_eq(7, skip_whitespace(string("  \t\r\n  1234"), 0));
  expect_eq(7, skip_whitespace(string("  \t\r\n  1234"), 3));
  expect_eq(7, skip_whitespace(string("  \t\r\n  "), 0));
  expect_eq(7, skip_whitespace(string("  \t\r\n  "), 3));
  expect_eq(4, skip_non_whitespace("1234 ", 0));
  expect_eq(4, skip_non_whitespace("1234 ", 2));
  expect_eq(4, skip_non_whitespace("1234\t", 0));
  expect_eq(4, skip_non_whitespace("1234\t", 2));
  expect_eq(4, skip_non_whitespace("1234\r", 0));
  expect_eq(4, skip_non_whitespace("1234\r", 2));
  expect_eq(4, skip_non_whitespace("1234\n", 0));
  expect_eq(4, skip_non_whitespace("1234\n", 2));
  expect_eq(4, skip_non_whitespace("1234", 0));
  expect_eq(4, skip_non_whitespace("1234", 2));
  expect_eq(4, skip_non_whitespace(string("1234 "), 0));
  expect_eq(4, skip_non_whitespace(string("1234 "), 2));
  expect_eq(4, skip_non_whitespace(string("1234\t"), 0));
  expect_eq(4, skip_non_whitespace(string("1234\t"), 2));
  expect_eq(4, skip_non_whitespace(string("1234\r"), 0));
  expect_eq(4, skip_non_whitespace(string("1234\r"), 2));
  expect_eq(4, skip_non_whitespace(string("1234\n"), 0));
  expect_eq(4, skip_non_whitespace(string("1234\n"), 2));
  expect_eq(4, skip_non_whitespace(string("1234"), 0));
  expect_eq(4, skip_non_whitespace(string("1234"), 2));

  fprintf(stderr, "-- skip_word\n");
  const char* sentence = "The quick brown fox jumped over the lazy dog.";
  vector<size_t> expected_offsets = {4, 10, 16, 20, 27, 32, 36, 41, 45};
  {
    vector<size_t> offsets;
    size_t offset = 0;
    while (sentence[offset]) {
      offset = skip_word(sentence, offset);
      offsets.emplace_back(offset);
    }
    expect_eq(expected_offsets, offsets);
  }
  {
    string sentence_str(sentence);
    vector<size_t> offsets;
    size_t offset = 0;
    while (sentence_str[offset]) {
      offset = skip_word(sentence_str, offset);
      offsets.emplace_back(offset);
    }
    expect_eq(expected_offsets, offsets);
  }

  fprintf(stderr, "-- parse_data_string/format_data_string with arbitrary data\n");
  {
    string input("/* omit 01 02 */ 03 ?04? $ ##30 $ ##127 ?\"dark\"? ###-1 \'cold\' %-1.667 %%-2.667");
    string expected_data(
        "\x03\x04" // 03 ?04?
        "\x00\x1E" // $ ##30 $
        "\x7F\x00" // ##127
        "\x64\x61\x72\x6B" // ?"dark"?
        "\xFF\xFF\xFF\xFF" // ###-1
        "\x63\x00\x6F\x00\x6C\x00\x64\x00" // 'cold'
        "\x42\x60\xD5\xBF" // %-1.667
        "\xBC\x74\x93\x18\x04\x56\x05\xC0", // %%-2.667
        34);
    string expected_mask("\xFF\x00\xFF\xFF\xFF\xFF\x00\x00\x00\x00\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF", 34);
    string output_mask;
    string output_data = parse_data_string(input, &output_mask);
    expect_eq(expected_data, output_data);
    expect_eq(expected_mask, output_mask);

    {
      string expected_formatted_input("03?04?001E7F00?6461726B?FFFFFFFF63006F006C0064004260D5BFBC749318045605C0");
      string formatted_input = format_data_string(output_data, &output_mask);
      expect_eq(expected_formatted_input, formatted_input);

      output_data = parse_data_string(input, &output_mask);
      expect_eq(expected_data, output_data);
      expect_eq(expected_mask, output_mask);
    }

    {
      string expected_formatted_input("0304001E7F006461726BFFFFFFFF63006F006C0064004260D5BFBC749318045605C0");
      string formatted_input = format_data_string(output_data, nullptr);
      expect_eq(expected_formatted_input, formatted_input);

      output_data = parse_data_string(input, &output_mask);
      expect_eq(expected_data, output_data);
      expect_eq(expected_mask, output_mask);
    }
  }

  fprintf(stderr, "-- parse_data_string/format_data_string with printable data\n");
  {
    string input("this is printable\nand it is sort of a haiku\nwith some control bytes\t\r\n");
    string expected_formatted("\"this is printable\\nand it is sort of a haiku\\nwith some control bytes\\t\\r\\n\"");
    string expected_formatted_hex("74686973206973207072696E7461626C650A616E6420697420697320736F7274206F662061206861696B750A7769746820736F6D6520636F6E74726F6C206279746573090D0A");
    string formatted = format_data_string(input);
    expect_eq(expected_formatted, formatted);
    expect_eq(input, parse_data_string(formatted));
    string formatted_hex = format_data_string(input, nullptr, FormatDataFlags::HEX_ONLY);
    expect_eq(expected_formatted_hex, formatted_hex);
    expect_eq(input, parse_data_string(formatted_hex));
  }

  fprintf(stderr, "-- parse_data_string/format_data_string with quotes in printable data\n");
  {
    string input("this string has \"some\" \'quotes\'.");
    string expected_formatted("\"this string has \\\"some\\\" \\\'quotes\\\'.\"");
    string formatted = format_data_string(input);
    expect_eq(expected_formatted, formatted);
    expect_eq(input, parse_data_string(formatted));
  }

  fprintf(stderr, "-- format_size\n");
  {
    expect_eq("0 bytes", format_size(0));
    expect_eq("1000 bytes", format_size(1000));
    expect_eq("1.50 KB", format_size(1536));
    expect_eq("1536 bytes (1.50 KB)", format_size(1536, true));
    expect_eq("1.00 GB", format_size(1073741824));
    expect_eq("1073741824 bytes (1.00 GB)", format_size(1073741824, true));
  }

  fprintf(stderr, "-- parse_size\n");
  {
    expect_eq(0, parse_size("0"));
    expect_eq(0, parse_size("0B"));
    expect_eq(0, parse_size("0 B"));
    expect_eq(0, parse_size("0 bytes"));
    expect_eq(1000, parse_size("1000 bytes"));
    expect_eq(1536, parse_size("1.5 KB"));
    expect_eq(3 * 1024 * 1024, parse_size("3 MB"));
  }

  fprintf(stderr, "-- escape_quotes\n");
  {
    expect_eq("", escape_quotes(""));
    expect_eq("omg hax", escape_quotes("omg hax"));
    expect_eq("\'omg\' \\\"hax\\\"", escape_quotes("\'omg\' \"hax\""));
  }

  fprintf(stderr, "-- escape_url\n");
  {
    expect_eq("", escape_url(""));
    expect_eq("omg%20hax", escape_url("omg hax"));
    expect_eq("slash/es", escape_url("slash/es"));
    expect_eq("slash%2Fes", escape_url("slash/es", true));
  }

  print_data_test();

  test_bit_reader();

  test_string_reader();

  // TODO: test string_vprintf
  // TODO: test log_level, set_log_level, log
  // TODO: test get_time_string
  // TODO: test string_for_error

  unlink("StringsTest-data");

  printf("StringsTest: all tests passed\n");
  return 0;
}